

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O3

void __thiscall
OpenMD::HydroIO::writeHydroProp
          (HydroIO *this,HydroProp *hp,RealType viscosity,RealType temperature,ostream *os)

{
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  pointer pcVar1;
  long *str;
  size_t sVar2;
  uint j;
  long lVar3;
  uint i;
  long lVar4;
  uint i_4;
  double (*__return_storage_ptr__) [6];
  uint i_2;
  undefined1 *__dest;
  double (*pitchAxes_00) [3];
  string name;
  RealType pitchScalar;
  string h;
  Vector3d cod;
  Vector3d pitches;
  Vector3d cop;
  Mat3x3d pitchAxes;
  Mat6x6d Xid;
  Mat6x6d Xi;
  long *local_390 [2];
  long local_380 [2];
  RealType local_370;
  double local_368;
  long *local_360 [2];
  long local_350 [2];
  Vector3d local_340;
  double local_328 [4];
  Vector3d local_308;
  Vector3d local_2f0;
  Vector3d local_2d8;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  double local_270 [36];
  undefined1 local_150 [288];
  
  local_370 = viscosity;
  if (this->writerOpen_ == false) {
    openWriter(this,os);
  }
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"OpenMD-Hydro","");
  local_390[0] = local_380;
  pcVar1 = (hp->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_390,pcVar1,pcVar1 + (hp->name_)._M_string_length);
  local_328[2] = (hp->cor_).super_Vector<double,_3U>.data_[2];
  local_328[0] = (hp->cor_).super_Vector<double,_3U>.data_[0];
  local_328[1] = (hp->cor_).super_Vector<double,_3U>.data_[1];
  __dest = local_150;
  memcpy(__dest,&hp->Xi_,0x120);
  HydroProp::getCenterOfDiffusion(&local_340,hp,temperature);
  local_2d8.super_Vector<double,_3U>.data_[0] = local_340.super_Vector<double,_3U>.data_[0];
  local_2d8.super_Vector<double,_3U>.data_[1] = local_340.super_Vector<double,_3U>.data_[1];
  local_2d8.super_Vector<double,_3U>.data_[2] = local_340.super_Vector<double,_3U>.data_[2];
  __return_storage_ptr__ = (double (*) [6])local_270;
  HydroProp::getDiffusionTensorAtPos((Mat6x6d *)__return_storage_ptr__,hp,&local_2d8,temperature);
  HydroProp::getCenterOfPitch(&local_2f0,hp);
  pitchAxes_00 = (double (*) [3])&local_2b8;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0.0;
  uStack_2a0 = 0;
  local_2b8 = 0.0;
  dStack_2b0 = 0.0;
  local_278 = 0;
  local_308.super_Vector<double,_3U>.data_[2] = 0.0;
  local_308.super_Vector<double,_3U>.data_[0] = 0.0;
  local_308.super_Vector<double,_3U>.data_[1] = 0.0;
  HydroProp::pitchAxes(hp,(Mat3x3d *)pitchAxes_00,&local_308,&local_368);
  this_00 = &this->w_;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(this_00);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"name",4,false);
  str = local_390[0];
  sVar2 = strlen((char *)local_390[0]);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,(Ch *)str,(SizeType)sVar2,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"viscosity",9,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(this_00,local_370);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"centerOfResistance",0x12,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_328[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"resistanceTensor",0x10,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(this_00);
    (this->w_).formatOptions_ = kFormatSingleLineArray;
    lVar3 = 0;
    do {
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(this_00,*(double *)(__dest + lVar3 * 8));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(this_00,0);
    (this->w_).formatOptions_ = kFormatDefault;
    lVar4 = lVar4 + 1;
    __dest = __dest + 0x30;
  } while (lVar4 != 6);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"temperature",0xb,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(this_00,temperature);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"centerOfDiffusion",0x11,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_340.super_Vector<double,_3U>.data_[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"diffusionTensor",0xf,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(this_00);
    (this->w_).formatOptions_ = kFormatSingleLineArray;
    lVar3 = 0;
    do {
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(this_00,((RectMatrix<double,_6U,_6U> *)*__return_storage_ptr__)->data_[0][lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(this_00,0);
    (this->w_).formatOptions_ = kFormatDefault;
    lVar4 = lVar4 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar4 != 6);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"pitch",5,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(this_00,local_368);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"centerOfPitch",0xd,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_2f0.super_Vector<double,_3U>.data_[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"momentsOfPitch",0xe,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_308.super_Vector<double,_3U>.data_[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,"pitchAxes",9,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  lVar4 = 0;
  do {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(this_00);
    (this->w_).formatOptions_ = kFormatSingleLineArray;
    lVar3 = 0;
    do {
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(this_00,(((SquareMatrix<double,_3> *)*pitchAxes_00)->super_RectMatrix<double,_3U,_3U>
                       ).data_[0][lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(this_00,0);
    (this->w_).formatOptions_ = kFormatDefault;
    lVar4 = lVar4 + 1;
    pitchAxes_00 = pitchAxes_00 + 1;
  } while (lVar4 != 3);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(this_00,0);
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  return;
}

Assistant:

void HydroIO::writeHydroProp(HydroProp* hp, RealType viscosity,
                               RealType temperature, std::ostream& os) {
    if (!writerOpen_) openWriter(os);

    std::string h    = "OpenMD-Hydro";
    std::string name = hp->getName();
    Vector3d cor     = hp->getCenterOfResistance();
    Mat6x6d Xi       = hp->getResistanceTensor();
    Vector3d cod     = hp->getCenterOfDiffusion(temperature);
    Mat6x6d Xid      = hp->getDiffusionTensorAtPos(cod, temperature);
    Vector3d cop     = hp->getCenterOfPitch();
    Mat3x3d pitchAxes;
    Vector3d pitches;
    RealType pitchScalar;

    hp->pitchAxes(pitchAxes, pitches, pitchScalar);

#if defined(NLOHMANN_JSON)

    ordered_json o;
    o["name"]               = name;
    o["viscosity"]          = viscosity;
    o["centerOfResistance"] = {cor[0], cor[1], cor[2]};
    o["resistanceTensor"]   = json::array();

    for (unsigned int i = 0; i < 6; i++) {
      o["resistanceTensor"][i] = {Xi(i, 0), Xi(i, 1), Xi(i, 2),
                                  Xi(i, 3), Xi(i, 4), Xi(i, 5)};
    }

    o["temperature"]       = temperature;
    o["centerOfDiffusion"] = {cod[0], cod[1], cod[2]};
    o["diffusionTensor"]   = json::array();

    for (unsigned int i = 0; i < 6; i++) {
      o["diffusionTensor"][i] = {Xid(i, 0), Xid(i, 1), Xid(i, 2),
                                 Xid(i, 3), Xid(i, 4), Xid(i, 5)};
    }

    o["pitch"]          = pitchScalar;
    o["centerOfPitch"]  = {cop[0], cop[1], cop[2]};
    o["momentsOfPitch"] = {pitches[0], pitches[1], pitches[2]};

    o["pitchAxes"] = json::array();
    for (unsigned int i = 0; i < 3; i++) {
      o["pitchAxes"][i] = {pitchAxes(i, 0), pitchAxes(i, 1), pitchAxes(i, 2)};
    }

    j_[h].push_back(o);

#elif defined(RAPID_JSON)

    w_.StartObject();
    w_.Key("name");
    w_.String(name.c_str());

    w_.Key("viscosity");
    w_.Double(viscosity);
    w_.Key("centerOfResistance");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);

    for (unsigned i = 0; i < 3; i++)
      w_.Double(cor[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("resistanceTensor");
    w_.StartArray();
    for (unsigned i = 0; i < 6; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);

      for (unsigned j = 0; j < 6; j++) {
        w_.Double(Xi(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.Key("temperature");
    w_.Double(temperature);
    w_.Key("centerOfDiffusion");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);

    for (unsigned i = 0; i < 3; i++)
      w_.Double(cod[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("diffusionTensor");
    w_.StartArray();
    for (unsigned i = 0; i < 6; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);

      for (unsigned j = 0; j < 6; j++) {
        w_.Double(Xid(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.Key("pitch");
    w_.Double(pitchScalar);

    w_.Key("centerOfPitch");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);
    for (unsigned i = 0; i < 3; i++)
      w_.Double(cop[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("momentsOfPitch");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);
    for (unsigned i = 0; i < 3; i++)
      w_.Double(pitches[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("pitchAxes");
    w_.StartArray();
    for (unsigned i = 0; i < 3; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);
      for (unsigned j = 0; j < 3; j++) {
        w_.Double(pitchAxes(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.EndObject();
#endif
  }